

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O0

void __thiscall KDReports::ReportPrivate::ensureLayouted(ReportPrivate *this)

{
  double dVar1;
  qreal qVar2;
  bool bVar3;
  int iVar4;
  QDebug *pQVar5;
  undefined8 uVar6;
  QSizeF QVar7;
  QMessageLogger local_70;
  QDebug local_50;
  QSizeF local_48;
  qreal local_38;
  qreal qStack_30;
  double local_28;
  qreal textDocWidth;
  qreal local_18;
  ReportPrivate *local_10;
  ReportPrivate *this_local;
  
  local_10 = this;
  if ((this->m_pageContentSizeDirty & 1U) != 0) {
    bVar3 = wantEndlessPrinting(this);
    if (bVar3) {
      if ((this->m_layoutWidth == 0.0) && (!NAN(this->m_layoutWidth))) {
        qt_assert("m_layoutWidth != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
                  ,0x72);
      }
      dVar1 = this->m_layoutWidth;
      qVar2 = mmToPixels(this->m_marginLeft + this->m_marginRight);
      local_28 = dVar1 - qVar2;
      QVar7 = layoutAsOnePage(this,local_28);
      qStack_30 = QVar7.ht;
      local_38 = QVar7.wd;
      (this->m_paperSize).wd = local_38;
      (this->m_paperSize).ht = qStack_30;
      QMessageLogger::QMessageLogger
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
                 ,0x76,"void KDReports::ReportPrivate::ensureLayouted()");
      QMessageLogger::debug();
      pQVar5 = QDebug::operator<<(&local_50,
                                  "setPaperSizeFromPrinter: endless printer. m_layoutWidth=");
      pQVar5 = QDebug::operator<<(pQVar5,this->m_layoutWidth);
      pQVar5 = QDebug::operator<<(pQVar5,"textDocWidth=");
      pQVar5 = QDebug::operator<<(pQVar5,local_28);
      pQVar5 = QDebug::operator<<(pQVar5,"single page has size");
      QDebug::QDebug((QDebug *)&local_48,pQVar5);
      ::operator<<((QDebug *)&local_48.ht,&local_48);
      QDebug::operator<<((QDebug *)&local_48.ht,"pixels");
      QDebug::~QDebug((QDebug *)&local_48.ht);
      QDebug::~QDebug((QDebug *)&local_48);
      QDebug::~QDebug(&local_50);
      iVar4 = (*this->m_layout->_vptr_AbstractReportLayout[6])();
      if (iVar4 != 1) {
        uVar6 = qt_assert("m_layout->numberOfPages() == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
                          ,0x79);
        QDebug::~QDebug(&local_50);
        _Unwind_Resume(uVar6);
      }
    }
    else {
      QVar7 = paperSize(this);
      local_18 = QVar7.ht;
      textDocWidth = QVar7.wd;
      setPaperSizeFromPrinter(this,QVar7);
    }
  }
  (*this->m_layout->_vptr_AbstractReportLayout[0xd])();
  return;
}

Assistant:

void KDReports::ReportPrivate::ensureLayouted()
{
    // We need to do a layout if
    // m_pageContentSizeDirty is true, i.e. page size has changed etc.
    if (m_pageContentSizeDirty) {
        if (!wantEndlessPrinting()) {
            setPaperSizeFromPrinter(paperSize());
        } else {
            // Get the document to fit into one page
            Q_ASSERT(m_layoutWidth != 0);
            qreal textDocWidth = m_layoutWidth - mmToPixels(m_marginLeft + m_marginRight);
            m_paperSize = layoutAsOnePage(textDocWidth);

            qDebug() << "setPaperSizeFromPrinter: endless printer. m_layoutWidth=" << m_layoutWidth << "textDocWidth=" << textDocWidth << "single page has size" << m_paperSize << "pixels";

            /* cppcheck-suppress assertWithSideEffect */
            Q_ASSERT(m_layout->numberOfPages() == 1);
        }
        // at this point m_pageContentSizeDirty has been set to false in all cases
    }

    m_layout->ensureLayouted();
}